

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_CALLBACK::Save
          (_Type_CALLBACK *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  bool bVar1;
  OStreamer *pOVar2;
  Variable *this_00;
  Object *pOVar3;
  Namer *stream_00;
  long *plVar4;
  offset_in_Memory_to_subr in_R8;
  code *local_80;
  uchar local_56 [6];
  OStreamer local_50;
  OStreamer streamer;
  Callback *C;
  offset_in_Memory_to_subr caller_local;
  Object *object_local;
  ostream *stream_local;
  _Type_CALLBACK *this_local;
  
  streamer.stream = (ostream *)Object::GetData<LiteScript::Callback>(object);
  OStreamer::OStreamer(&local_50,stream);
  bVar1 = Callback::isInternal((Callback *)streamer.stream);
  if (bVar1) {
    local_56[5] = 0;
    pOVar2 = OStreamer::operator<<(&local_50,local_56 + 5);
    OStreamer::operator<<(pOVar2,*(uint **)(streamer.stream + 0xa8));
  }
  else {
    local_56[4] = 1;
    pOVar2 = OStreamer::operator<<(&local_50,local_56 + 4);
    pOVar2 = OStreamer::operator<<(pOVar2,*(uint **)(streamer.stream + 0x98));
    OStreamer::operator<<(pOVar2,*(uint **)(streamer.stream + 0xa0));
  }
  if ((**(byte **)(streamer.stream + 0x38) & 1) == 0) {
    local_56[2] = 1;
    OStreamer::operator<<(&local_50,local_56 + 2);
    plVar4 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    local_80 = (code *)caller;
    if ((caller & 1) != 0) {
      local_80 = *(code **)(*plVar4 + (caller - 1));
    }
    this_00 = Nullable<LiteScript::Variable>::operator*
                        ((Nullable<LiteScript::Variable> *)(streamer.stream + 0x20));
    pOVar3 = Variable::operator->(this_00);
    (*local_80)(plVar4,stream,pOVar3->ID);
  }
  else {
    local_56[3] = 0;
    OStreamer::operator<<(&local_50,local_56 + 3);
  }
  if ((**(byte **)(streamer.stream + 0x90) & 1) == 0) {
    local_56[0] = '\x01';
    OStreamer::operator<<(&local_50,local_56);
    stream_00 = Nullable<LiteScript::Namer>::operator*
                          ((Nullable<LiteScript::Namer> *)(streamer.stream + 0x40));
    Namer::Save((Namer *)stream,(ostream *)stream_00,(Namer *)caller,in_R8);
  }
  else {
    local_56[1] = 0;
    OStreamer::operator<<(&local_50,local_56 + 1);
  }
  return;
}

Assistant:

void LiteScript::_Type_CALLBACK::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Callback& C = object.GetData<Callback>();
    OStreamer streamer(stream);
    if (C.isInternal())
        streamer << (unsigned char)0 << C.CallbackIndex;
    else
        streamer << (unsigned char)1 << C.I << C.L;
    if (C.This.isNull)
        streamer << (unsigned char)0;
    else {
        streamer << (unsigned char) 1;
        (object.memory.*caller)(stream, (*C.This)->ID);
    }
    if (C.nsp.isNull)
        streamer << (unsigned char)0;
    else {
        streamer << (unsigned char) 1;
        Namer::Save(stream, *C.nsp, caller);
    }
}